

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O2

void flatcc_json_printer_union_table
               (flatcc_json_printer_t *ctx,flatcc_json_printer_union_descriptor_t *ud,
               flatcc_json_printer_table_f *pf)

{
  print_table_object(ctx,(void *)((ulong)*ud->member + (long)ud->member),ud->ttl,pf);
  return;
}

Assistant:

void flatcc_json_printer_union_table(flatcc_json_printer_t *ctx,
        flatcc_json_printer_union_descriptor_t *ud,
        flatcc_json_printer_table_f pf)
{
    print_table_object(ctx, read_uoffset_ptr(ud->member), ud->ttl, pf);
}